

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wl_monitor.c
# Opt level: O0

void outputHandleMode(void *userData,wl_output *output,uint32_t flags,int32_t width,int32_t height,
                     int32_t refresh)

{
  void *pvVar1;
  undefined8 *puVar2;
  undefined4 in_ECX;
  uint in_EDX;
  long in_RDI;
  undefined4 in_R8D;
  int in_R9D;
  double dVar3;
  GLFWvidmode mode;
  _GLFWmonitor *monitor;
  undefined4 uVar4;
  undefined4 uVar5;
  
  uVar4 = 8;
  uVar5 = 8;
  dVar3 = round((double)in_R9D / 1000.0);
  *(int *)(in_RDI + 0xa0) = *(int *)(in_RDI + 0xa0) + 1;
  pvVar1 = _glfw_realloc((void *)CONCAT44(uVar5,uVar4),CONCAT44(in_R8D,in_ECX));
  *(void **)(in_RDI + 0x98) = pvVar1;
  puVar2 = (undefined8 *)(*(long *)(in_RDI + 0x98) + (long)(*(int *)(in_RDI + 0xa0) + -1) * 0x18);
  *puVar2 = CONCAT44(in_R8D,in_ECX);
  puVar2[1] = CONCAT44(uVar5,uVar4);
  puVar2[2] = CONCAT44((int)dVar3,8);
  if ((in_EDX & 1) != 0) {
    *(int *)(in_RDI + 0x10c) = *(int *)(in_RDI + 0xa0) + -1;
  }
  return;
}

Assistant:

static void outputHandleMode(void* userData,
                             struct wl_output* output,
                             uint32_t flags,
                             int32_t width,
                             int32_t height,
                             int32_t refresh)
{
    struct _GLFWmonitor* monitor = userData;
    GLFWvidmode mode;

    mode.width = width;
    mode.height = height;
    mode.redBits = 8;
    mode.greenBits = 8;
    mode.blueBits = 8;
    mode.refreshRate = (int) round(refresh / 1000.0);

    monitor->modeCount++;
    monitor->modes =
        _glfw_realloc(monitor->modes, monitor->modeCount * sizeof(GLFWvidmode));
    monitor->modes[monitor->modeCount - 1] = mode;

    if (flags & WL_OUTPUT_MODE_CURRENT)
        monitor->wl.currentMode = monitor->modeCount - 1;
}